

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O1

void __thiscall FastPForLib::ZRandom::seed(ZRandom *this,uint iSeed)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int i;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  this->nValues = 0;
  this->MT[0] = iSeed;
  lVar4 = 1;
  do {
    iSeed = iSeed * 0x10dcd + 1;
    this->MT[lVar4] = iSeed;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  lVar4 = 0x139;
  auVar8._8_4_ = 0x18d;
  auVar8._0_8_ = 0x18d0000018d;
  auVar8._12_4_ = 0x18d;
  auVar8._16_4_ = 0x18d;
  auVar8._20_4_ = 0x18d;
  auVar8._24_4_ = 0x18d;
  auVar8._28_4_ = 0x18d;
  auVar9._8_4_ = 0x1a41a41b;
  auVar9._0_8_ = 0x1a41a41b1a41a41b;
  auVar9._12_4_ = 0x1a41a41b;
  auVar9._16_4_ = 0x1a41a41b;
  auVar9._20_4_ = 0x1a41a41b;
  auVar9._24_4_ = 0x1a41a41b;
  auVar9._28_4_ = 0x1a41a41b;
  auVar3 = vpmovsxbd_avx2(ZEXT816(0xf070d050b030901));
  auVar10._8_4_ = 0x270;
  auVar10._0_8_ = 0x27000000270;
  auVar10._12_4_ = 0x270;
  auVar10._16_4_ = 0x270;
  auVar10._20_4_ = 0x270;
  auVar10._24_4_ = 0x270;
  auVar10._28_4_ = 0x270;
  auVar6 = vpbroadcastq_avx512f();
  auVar11._8_4_ = 8;
  auVar11._0_8_ = 0x800000008;
  auVar11._12_4_ = 8;
  auVar11._16_4_ = 8;
  auVar11._20_4_ = 8;
  auVar11._24_4_ = 8;
  auVar11._28_4_ = 8;
  do {
    auVar1 = vpaddd_avx2(auVar2,auVar8);
    auVar12 = vpsrld_avx2(auVar1,4);
    auVar5 = vpmuludq_avx2(auVar12,auVar9);
    auVar12 = vpshufd_avx2(auVar12,0xf5);
    auVar12 = vpmuludq_avx2(auVar12,auVar9);
    auVar5 = vpermt2d_avx512vl(auVar5,auVar3,auVar12);
    auVar5 = vpsrld_avx2(auVar5,2);
    auVar5 = vpmulld_avx2(auVar5,auVar10);
    auVar1 = vpsubd_avx2(auVar1,auVar5);
    auVar7 = vpmovzxdq_avx512f(auVar1);
    auVar7 = vpsllq_avx512f(auVar7,2);
    auVar7 = vpaddq_avx512f(auVar6,auVar7);
    auVar7 = vmovdqu64_avx512f(auVar7);
    *(undefined1 (*) [64])(this->MT + lVar4 * 2) = auVar7;
    auVar2 = vpaddd_avx2(auVar2,auVar11);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x3a9);
  return;
}

Assistant:

void ZRandom::seed(unsigned iSeed) {
  nValues = 0;
  // Seed the array used in random number generation.
  MT[0] = iSeed;
  for (int i = 1; i < N; ++i) {
    MT[i] = 1 + (69069 * MT[i - 1]);
  }
  // Compute map once to avoid % in inner loop.
  for (int i = 0; i < N; ++i) {
    map[i] = MT + ((i + M) % N);
  }
}